

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

int __thiscall ncnn::Log::forward_inplace(Log *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  double dVar3;
  int i_1;
  float *ptr_1;
  int q_1;
  float log_base_inv;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int in_stack_ffffffffffffff14;
  Mat *in_stack_ffffffffffffff18;
  int local_98;
  int local_90;
  Mat local_80;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x38);
  local_28 = local_1c * local_20;
  if ((*(float *)(in_RDI + 0xd0) != -1.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    dVar2 = std::log((double)(ulong)*(uint *)(in_RDI + 0xd0));
    for (local_98 = 0; local_98 < local_24; local_98 = local_98 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      pfVar1 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff18);
      ncnn::Mat::~Mat((Mat *)0x4ad92f);
      for (in_stack_ffffffffffffff14 = 0; in_stack_ffffffffffffff14 < local_28;
          in_stack_ffffffffffffff14 = in_stack_ffffffffffffff14 + 1) {
        dVar3 = std::log((double)(ulong)(uint)(*(float *)(in_RDI + 0xd8) +
                                              pfVar1[in_stack_ffffffffffffff14] *
                                              *(float *)(in_RDI + 0xd4)));
        pfVar1[in_stack_ffffffffffffff14] = SUB84(dVar3,0) * (1.0 / SUB84(dVar2,0));
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      pfVar1 = ncnn::Mat::operator_cast_to_float_(&local_80);
      ncnn::Mat::~Mat((Mat *)0x4ad7e5);
      local_38 = pfVar1;
      for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
        dVar2 = std::log((double)(ulong)(uint)(*(float *)(in_RDI + 0xd8) +
                                              local_38[local_90] * *(float *)(in_RDI + 0xd4)));
        local_38[local_90] = SUB84(dVar2,0);
      }
    }
  }
  return 0;
}

Assistant:

int Log::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(log(shift + ptr[i] * scale));
            }
        }
    }
    else
    {
        float log_base_inv = static_cast<float>(1.f / log(base));

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(log(shift + ptr[i] * scale) * log_base_inv);
            }
        }
    }

    return 0;
}